

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_fractional.c
# Opt level: O3

void WebRtcSpl_ResampDotProduct
               (int32_t *in1,int32_t *in2,int16_t *coef_ptr,int32_t *out1,int32_t *out2)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  
  sVar1 = *coef_ptr;
  sVar2 = coef_ptr[1];
  iVar10 = *in2;
  iVar11 = in2[-1];
  sVar3 = coef_ptr[2];
  iVar12 = in2[-2];
  sVar4 = coef_ptr[3];
  iVar13 = in2[-3];
  sVar5 = coef_ptr[4];
  iVar14 = in2[-4];
  sVar6 = coef_ptr[5];
  iVar15 = in2[-5];
  sVar7 = coef_ptr[6];
  iVar16 = in2[-6];
  sVar8 = coef_ptr[7];
  iVar17 = in2[-7];
  sVar9 = coef_ptr[8];
  *out1 = in1[8] * (int)sVar9 + in1[7] * (int)sVar8 + 0x4000 +
          in1[6] * (int)sVar7 + in1[5] * (int)sVar6 + in1[4] * (int)sVar5 +
          in1[3] * (int)sVar4 + in1[2] * (int)sVar3 + in1[1] * (int)sVar2 + *in1 * (int)sVar1;
  *out2 = (int)sVar9 * in2[-8] + sVar8 * iVar17 + 0x4000 +
          sVar7 * iVar16 + sVar6 * iVar15 + sVar5 * iVar14 +
          sVar4 * iVar13 + sVar3 * iVar12 + sVar2 * iVar11 + sVar1 * iVar10;
  return;
}

Assistant:

static void WebRtcSpl_ResampDotProduct(const int32_t *in1, const int32_t *in2,
                                       const int16_t *coef_ptr, int32_t *out1,
                                       int32_t *out2)
{
    int32_t tmp1 = 16384;
    int32_t tmp2 = 16384;
    int16_t coef;

    coef = coef_ptr[0];
    tmp1 += coef * in1[0];
    tmp2 += coef * in2[-0];

    coef = coef_ptr[1];
    tmp1 += coef * in1[1];
    tmp2 += coef * in2[-1];

    coef = coef_ptr[2];
    tmp1 += coef * in1[2];
    tmp2 += coef * in2[-2];

    coef = coef_ptr[3];
    tmp1 += coef * in1[3];
    tmp2 += coef * in2[-3];

    coef = coef_ptr[4];
    tmp1 += coef * in1[4];
    tmp2 += coef * in2[-4];

    coef = coef_ptr[5];
    tmp1 += coef * in1[5];
    tmp2 += coef * in2[-5];

    coef = coef_ptr[6];
    tmp1 += coef * in1[6];
    tmp2 += coef * in2[-6];

    coef = coef_ptr[7];
    tmp1 += coef * in1[7];
    tmp2 += coef * in2[-7];

    coef = coef_ptr[8];
    *out1 = tmp1 + coef * in1[8];
    *out2 = tmp2 + coef * in2[-8];
}